

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCDisassembler.c
# Opt level: O1

_Bool PPC_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                        uint64_t address,void *info)

{
  cs_detail *__s;
  long lVar1;
  uint8_t *puVar2;
  uint uVar3;
  uint8_t *orig_p;
  byte bVar4;
  MCInst *MI;
  uint uVar5;
  uint64_t Address;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint8_t *orig_p_2;
  uint8_t *puVar9;
  ulong uVar10;
  byte *pbVar11;
  uint8_t *orig_p_1;
  DecodeStatus S;
  uint64_t Value_4;
  int local_3c;
  
  if (code_len < 4) {
    *size = 0;
    return false;
  }
  if (instr->csh->mode < CS_MODE_ARM) {
    uVar3 = (uint)code[2] << 8 | (uint)code[1] << 0x10 | (uint)*code << 0x18;
    code = code + 3;
  }
  else {
    uVar3 = (uint)code[1] << 8 | (uint)code[2] << 0x10 | (uint)code[3] << 0x18;
  }
  uVar3 = *code | uVar3;
  __s = instr->flat_insn->detail;
  if (__s != (cs_detail *)0x0) {
    memset(__s,0,0x5f8);
  }
  uVar5 = 0;
  local_3c = 3;
  Address = 0xffffffff;
  puVar2 = DecoderTable32;
  do {
    puVar9 = puVar2;
    switch(*puVar9) {
    case '\x01':
      uVar5 = ~(-1 << (puVar9[2] & 0x1f)) << (puVar9[1] & 0x1f);
      if (puVar9[2] == 0x20) {
        uVar5 = 0xffffffff;
      }
      uVar5 = (uVar5 & uVar3) >> (puVar9[1] & 0x1f);
      puVar2 = puVar9 + 3;
      break;
    case '\x02':
      uVar8 = 0;
      address = 0;
      bVar4 = 0;
      do {
        lVar1 = uVar8 + 1;
        address = address + ((puVar9[lVar1] & 0x7f) << (bVar4 & 0x1f));
        bVar4 = bVar4 + 7;
        uVar8 = uVar8 + 1;
      } while ((char)puVar9[lVar1] < '\0');
      puVar2 = puVar9 + (uVar8 & 0xffffffff) + 3;
      if (uVar5 != (uint)address) {
        puVar2 = puVar9 + (uVar8 & 0xffffffff) + 3 + *(ushort *)(puVar9 + (uVar8 & 0xffffffff) + 1);
      }
      break;
    case '\x03':
      uVar7 = ~(-1 << (puVar9[2] & 0x1f)) << (puVar9[1] & 0x1f);
      uVar8 = 0;
      address = 0;
      bVar4 = 0;
      do {
        lVar1 = uVar8 + 3;
        address = address + ((puVar9[lVar1] & 0x7f) << (bVar4 & 0x1f));
        bVar4 = bVar4 + 7;
        uVar8 = uVar8 + 1;
      } while ((char)puVar9[lVar1] < '\0');
      if (puVar9[2] == 0x20) {
        uVar7 = 0xffffffff;
      }
      puVar2 = puVar9 + (uVar8 & 0xffffffff) + 5;
      if ((uVar7 & uVar3) >> (puVar9[1] & 0x1f) != (uint)address) {
        puVar2 = puVar9 + (uVar8 & 0xffffffff) + 5 + *(ushort *)(puVar9 + (uVar8 & 0xffffffff) + 3);
      }
      break;
    case '\x04':
      uVar8 = 0;
      do {
        lVar1 = uVar8 + 1;
        uVar8 = uVar8 + 1;
      } while ((char)puVar9[lVar1] < '\0');
      puVar2 = puVar9 + (uVar8 & 0xffffffff) + 3;
      break;
    case '\x05':
      uVar8 = 0;
      uVar5 = 0;
      bVar4 = 0;
      do {
        lVar1 = uVar8 + 1;
        uVar5 = uVar5 + ((puVar9[lVar1] & 0x7f) << (bVar4 & 0x1f));
        bVar4 = bVar4 + 7;
        uVar8 = uVar8 + 1;
      } while ((char)puVar9[lVar1] < '\0');
      pbVar11 = puVar9 + (uVar8 & 0xffffffff) + 1;
      S = MCDisassembler_Fail;
      MI = (MCInst *)0x0;
      do {
        bVar4 = *pbVar11;
        S = S + ((bVar4 & 0x7f) << ((byte)MI & 0x1f));
        MI = (MCInst *)(ulong)((int)MI + 7);
        pbVar11 = pbVar11 + 1;
      } while ((char)bVar4 < '\0');
      MCInst_setOpcode(instr,uVar5);
      decodeToMCInst_4(S,uVar3,(uint32_t)instr,MI,Address,(void *)address);
LAB_00191b60:
      if (local_3c == 0) {
        MCInst_clear(instr);
        *size = 0;
      }
      else {
        *size = 4;
      }
      return local_3c == 3;
    case '\x06':
      uVar8 = 0;
      uVar7 = 0;
      bVar4 = 0;
      do {
        lVar1 = uVar8 + 1;
        uVar7 = uVar7 + ((puVar9[lVar1] & 0x7f) << (bVar4 & 0x1f));
        bVar4 = bVar4 + 7;
        uVar8 = uVar8 + 1;
      } while ((char)puVar9[lVar1] < '\0');
      uVar10 = 0;
      uVar6 = 0;
      bVar4 = 0;
      do {
        lVar1 = uVar10 + (uVar8 & 0xffffffff) + 1;
        uVar6 = uVar6 + ((puVar9[lVar1] & 0x7f) << (bVar4 & 0x1f));
        bVar4 = bVar4 + 7;
        uVar10 = uVar10 + 1;
      } while ((char)puVar9[lVar1] < '\0');
      uVar7 = uVar6 & ~uVar3 | uVar7 & uVar3;
      address = (uint64_t)uVar7;
      puVar2 = puVar9 + (uVar10 & 0xffffffff) + (uVar8 & 0xffffffff) + 1;
      if (uVar7 != 0) {
        local_3c = 1;
      }
      break;
    default:
      local_3c = 0;
      goto LAB_00191b60;
    }
  } while( true );
}

Assistant:

static DecodeStatus getInstruction(MCInst *MI,
		const uint8_t *code, size_t code_len,
		uint16_t *Size,
		uint64_t Address, MCRegisterInfo *MRI)
{
	uint32_t insn;
	DecodeStatus result;
	// Get the four bytes of the instruction.
	if (code_len < 4) {
		// not enough data
		*Size = 0;
		return MCDisassembler_Fail;
	}

	// The instruction is big-endian encoded.
	if (MI->csh->mode & CS_MODE_BIG_ENDIAN)
		insn = (code[0] << 24) | (code[1] << 16) |
			(code[2] <<  8) | (code[3] <<  0);
	else
		insn = (code[3] << 24) | (code[2] << 16) |
			(code[1] <<  8) | (code[0] <<  0);

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, sizeof(cs_detail));
	}

	result = decodeInstruction_4(DecoderTable32, MI, insn, Address, 4);
	if (result != MCDisassembler_Fail) {
		*Size = 4;
		return result;
	}

	// report error
	MCInst_clear(MI);
	*Size = 0;
	return MCDisassembler_Fail;
}